

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O3

bool __thiscall iDynTree::BerdyHelper::initOriginalBerdyFixedBase(BerdyHelper *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  long *plVar6;
  long lVar7;
  SensorType *pSVar8;
  undefined8 uVar9;
  ulong uVar10;
  ostream *poVar11;
  ulong uVar12;
  stringstream ss;
  long *local_200;
  long local_1f8;
  long local_1f0 [2];
  uint local_1dc;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  lVar5 = iDynTree::Model::getNrOfJoints();
  if (0 < lVar5) {
    lVar5 = 0;
    do {
      plVar6 = (long *)iDynTree::Model::getJoint((long)this);
      iVar3 = (**(code **)(*plVar6 + 0x20))(plVar6);
      if (iVar3 != 1) {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Joint ",6);
        iDynTree::Model::getJointName_abi_cxx11_((long)&local_200);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,(char *)local_200,local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11," has ",5);
        plVar6 = (long *)iDynTree::Model::getJoint((long)this);
        (**(code **)(*plVar6 + 0x20))(plVar6);
        poVar11 = std::ostream::_M_insert<unsigned_long>((ulong)poVar11);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,
                   " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames"
                   ,0x53);
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        std::__cxx11::stringbuf::str();
        iDynTree::reportError("BerdyHelpers","init",(char *)local_200);
LAB_001304b8:
        if (local_200 != local_1f0) {
          operator_delete(local_200,local_1f0[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        return false;
      }
      lVar5 = lVar5 + 1;
      lVar7 = iDynTree::Model::getNrOfJoints();
    } while (lVar5 < lVar7);
  }
  local_1dc = 0;
  uVar4 = 0xffffffff;
  do {
    if (uVar4 < 4) {
      pSVar8 = (SensorType *)iDynTree::Model::sensors();
      lVar5 = iDynTree::SensorsList::getNrOfSensors(pSVar8);
      if (lVar5 != 0) {
        uVar12 = 0;
        do {
          pSVar8 = (SensorType *)iDynTree::Model::sensors();
          uVar9 = iDynTree::SensorsList::getSensor(pSVar8,(long)&local_1dc);
          plVar6 = (long *)__dynamic_cast(uVar9,&Sensor::typeinfo,&LinkSensor::typeinfo,0);
          lVar5 = (**(code **)(*plVar6 + 0x50))(plVar6);
          iDynTree::Traversal::getBaseLink();
          lVar7 = iDynTree::Link::getIndex();
          if (lVar5 == lVar7) {
            std::__cxx11::stringstream::stringstream(local_1b8);
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Sensor ",7);
            (**(code **)(*plVar6 + 0x10))(&local_200,plVar6);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (local_1a8,(char *)local_200,local_1f8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar11," is attached to link ",0x15)
            ;
            iDynTree::Model::getLinkName_abi_cxx11_((long)&local_1d8);
            poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                                (poVar11,(char *)local_1d8,local_1d0);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar11,
                       " but this link is the base link and base link sensors are not supported by the original berdy."
                       ,0x5e);
            if (local_1d8 != local_1c8) {
              operator_delete(local_1d8,local_1c8[0] + 1);
            }
            if (local_200 != local_1f0) {
              operator_delete(local_200,local_1f0[0] + 1);
            }
            std::__cxx11::stringbuf::str();
            iDynTree::reportError("BerdyHelpers","init",(char *)local_200);
            goto LAB_001304b8;
          }
          uVar12 = uVar12 + 1;
          pSVar8 = (SensorType *)iDynTree::Model::sensors();
          uVar10 = iDynTree::SensorsList::getNrOfSensors(pSVar8);
        } while (uVar12 < uVar10);
      }
    }
    uVar1 = local_1dc + 1;
    bVar2 = 3 < (int)local_1dc;
    uVar4 = local_1dc;
    local_1dc = uVar1;
    if (bVar2) {
      lVar5 = iDynTree::Model::getNrOfDOFs();
      lVar7 = 0x14;
      if ((this->m_options).includeAllNetExternalWrenchesAsDynamicVariables != false) {
        lVar7 = 0x1a;
      }
      this->m_nrOfDynamicalVariables = lVar7 * lVar5;
      this->m_nrOfDynamicEquations = lVar5 * 0x13;
      initSensorsMeasurements(this);
      return true;
    }
  } while( true );
}

Assistant:

bool BerdyHelper::initOriginalBerdyFixedBase()
{
    // Check that all joints have 1 dof
    for(JointIndex jntIdx = 0; jntIdx < static_cast<JointIndex>(m_model.getNrOfJoints()); jntIdx++)
    {
        if( m_model.getJoint(jntIdx)->getNrOfDOFs() != 1 )
        {
            std::stringstream ss;
            ss << "Joint " << m_model.getJointName(jntIdx) << " has " << m_model.getJoint(jntIdx)->getNrOfDOFs() << " DOFs , but the original fixed base formulation of berdy only supports 1 dof frames";
            reportError("BerdyHelpers","init",ss.str().c_str());
            return false;
        }
    }

    // Check that no sensors are attached to the base (this is not supported by the original berdy)
    for(SensorType type=SIX_AXIS_FORCE_TORQUE; type < NR_OF_SENSOR_TYPES; type = (SensorType)(type+1))
    {
        // TODO : link sensor are extremly widespared and they have all approximatly the same API,
        //        so we need a better way to iterate over them
        if( isLinkSensor(type) )
        {
            for(size_t sensIdx = 0; sensIdx < m_model.sensors().getNrOfSensors(type); sensIdx++)
            {
                LinkSensor * linkSensor = dynamic_cast<LinkSensor*>(m_model.sensors().getSensor(type,sensIdx));

                LinkIndex   linkToWhichTheSensorIsAttached = linkSensor->getParentLinkIndex();

                if( linkToWhichTheSensorIsAttached == m_dynamicsTraversal.getBaseLink()->getIndex() )
                {
                    std::stringstream ss;
                    ss << "Sensor " << linkSensor->getName() << " is attached to link " << m_model.getLinkName(linkToWhichTheSensorIsAttached) << " but this link is the base link and base link sensors are not supported by the original berdy.";
                    reportError("BerdyHelpers","init",ss.str().c_str());
                    return false;
                }
            }
        }
    }


    // N will be the number of joints/links/dofs
    // We assume that the fixed base is fixed, so we include in the model only N links
    size_t nrOfDOFs = m_model.getNrOfDOFs();

    // In the classical Berdy formulation, we have 6*4 + 2*1 dynamical variables
    size_t nrOfDynamicVariablesForDOFs = m_options.includeAllNetExternalWrenchesAsDynamicVariables ? 6*4+2*1 : 6*3+2*1;
    m_nrOfDynamicalVariables = nrOfDynamicVariablesForDOFs*nrOfDOFs;
    // 19 Dynamics equations are considered in the original berdy :
    // 6 for the propagation of 6d acceleration
    // 6 for the computation of the net wrench from acc and vel
    // 6 for the computation of the joint wrench
    // 1 for the torque computations
    m_nrOfDynamicEquations   = (18+1)*nrOfDOFs;

    initSensorsMeasurements();

    return true;
}